

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O3

void __thiscall
wasm::FunctionValidator::validatePoppyExpression(FunctionValidator *this,Expression *curr)

{
  Id IVar1;
  bool bVar2;
  Index IVar3;
  Expression ***pppEVar4;
  Index IVar5;
  Index IVar6;
  AbstractChildIterator<wasm::ChildIterator> local_70;
  
  if ((curr->type).id == 1) {
    bVar2 = StackUtils::mayBeUnreachable(curr);
    ValidationInfo::shouldBeTrue<wasm::Expression*>
              (this->info,bVar2,curr,
               "Only control flow structures and unreachable polymorphic instructions may be unreachable in Poppy IR"
               ,(this->
                super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                ).
                super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                .
                super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                .currFunction);
  }
  IVar1 = curr->_id;
  if ((int)IVar1 < 3) {
    if (IVar1 == BlockId) {
      return;
    }
    if (IVar1 == IfId) {
      ValidationInfo::shouldBeTrue<wasm::Expression*>
                (this->info,**(int **)(curr + 1) == 0x28,curr,"Expected condition to be a Pop",
                 (this->
                 super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                 ).
                 super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                 .
                 super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                 .currFunction);
      ValidationInfo::shouldBeTrue<wasm::Expression*>
                (this->info,*(int *)curr[1].type.id == 1,curr,
                 "Expected control flow child to be a block",
                 (this->
                 super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                 ).
                 super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                 .
                 super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                 .currFunction);
      if (*(int **)(curr + 2) == (int *)0x0) {
        bVar2 = true;
      }
      else {
        bVar2 = **(int **)(curr + 2) == 1;
      }
      ValidationInfo::shouldBeTrue<wasm::Expression*>
                (this->info,bVar2,curr,"Expected control flow child to be a block",
                 (this->
                 super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                 ).
                 super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                 .
                 super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                 .currFunction);
      return;
    }
  }
  else if ((IVar1 == LoopId) || (IVar1 == TryId)) {
    AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator(&local_70,curr);
    IVar5 = (int)((ulong)((long)local_70.children.flexible.
                                super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_70.children.flexible.
                               super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) +
            (int)local_70.children.usedFixed;
    if (IVar5 != 0) {
      IVar6 = 0;
      do {
        IVar3 = AbstractChildIterator<wasm::ChildIterator>::mapIndex(&local_70,IVar6);
        pppEVar4 = local_70.children.flexible.
                   super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                   _M_impl.super__Vector_impl_data._M_start + ((ulong)IVar3 - 4);
        if (IVar3 < 4) {
          pppEVar4 = local_70.children.fixed._M_elems + IVar3;
        }
        ValidationInfo::shouldBeTrue<wasm::Expression*>
                  (this->info,(**pppEVar4)->_id == BlockId,curr,
                   "Expected control flow child to be a block",
                   (this->
                   super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                   ).
                   super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                   .
                   super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                   .currFunction);
        IVar6 = IVar6 + 1;
      } while (IVar5 != IVar6);
    }
    goto LAB_009c2e68;
  }
  AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator(&local_70,curr);
  IVar5 = (int)((ulong)((long)local_70.children.flexible.
                              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_70.children.flexible.
                             super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) +
          (int)local_70.children.usedFixed;
  if (IVar5 != 0) {
    IVar6 = 0;
    do {
      IVar3 = AbstractChildIterator<wasm::ChildIterator>::mapIndex(&local_70,IVar6);
      pppEVar4 = local_70.children.flexible.
                 super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                 _M_impl.super__Vector_impl_data._M_start + ((ulong)IVar3 - 4);
      if (IVar3 < 4) {
        pppEVar4 = local_70.children.fixed._M_elems + IVar3;
      }
      ValidationInfo::shouldBeTrue<wasm::Expression*>
                (this->info,(**pppEVar4)->_id == PopId,curr,"Unexpected non-Pop child",
                 (this->
                 super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                 ).
                 super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                 .
                 super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                 .currFunction);
      IVar6 = IVar6 + 1;
    } while (IVar5 != IVar6);
  }
LAB_009c2e68:
  if (local_70.children.flexible.
      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.children.flexible.
                    super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.children.flexible.
                          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.children.flexible.
                          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FunctionValidator::validatePoppyExpression(Expression* curr) {
  if (curr->type == Type::unreachable) {
    shouldBeTrue(StackUtils::mayBeUnreachable(curr),
                 curr,
                 "Only control flow structures and unreachable polymorphic"
                 " instructions may be unreachable in Poppy IR");
  }
  if (Properties::isControlFlowStructure(curr)) {
    // Check that control flow children (except If conditions) are blocks
    if (auto* if_ = curr->dynCast<If>()) {
      shouldBeTrue(
        if_->condition->is<Pop>(), curr, "Expected condition to be a Pop");
      shouldBeTrue(if_->ifTrue->is<Block>(),
                   curr,
                   "Expected control flow child to be a block");
      shouldBeTrue(!if_->ifFalse || if_->ifFalse->is<Block>(),
                   curr,
                   "Expected control flow child to be a block");
    } else if (!curr->is<Block>()) {
      for (auto* child : ChildIterator(curr)) {
        shouldBeTrue(child->is<Block>(),
                     curr,
                     "Expected control flow child to be a block");
      }
    }
  } else {
    // Check that all children are Pops
    for (auto* child : ChildIterator(curr)) {
      shouldBeTrue(child->is<Pop>(), curr, "Unexpected non-Pop child");
    }
  }
}